

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

void __thiscall
adios2sys::RegularExpression::RegularExpression(RegularExpression *this,RegularExpression *rxp)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  memset(this,0,0x208);
  if (rxp->program == (char *)0x0) {
    this->program = (char *)0x0;
  }
  else {
    iVar1 = rxp->progsize;
    lVar5 = (long)iVar1;
    this->progsize = iVar1;
    iVar2 = -1;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    pcVar3 = (char *)operator_new__((long)iVar2);
    this->program = pcVar3;
    for (; lVar5 != 0; lVar5 = lVar5 + -1) {
      this->program[lVar5 + -1] = rxp->program[lVar5 + -1];
    }
    memcpy(this,rxp,0x208);
    pcVar3 = rxp->regmust;
    this->regmust = pcVar3;
    if (pcVar3 != (char *)0x0) {
      uVar4 = 0;
      if (rxp->program != pcVar3) {
        uVar4 = (ulong)(uint)((int)pcVar3 - (int)rxp->program);
      }
      this->regmust = this->program + uVar4;
    }
    this->regstart = rxp->regstart;
    this->reganch = rxp->reganch;
    this->regmlen = rxp->regmlen;
  }
  return;
}

Assistant:

RegularExpression::RegularExpression(const RegularExpression& rxp)
{
  if (!rxp.program) {
    this->program = nullptr;
    return;
  }
  int ind;
  this->progsize = rxp.progsize;            // Copy regular expression size
  this->program = new char[this->progsize]; // Allocate storage
  for (ind = this->progsize; ind-- != 0;)   // Copy regular expression
    this->program[ind] = rxp.program[ind];
  // Copy pointers into last successful "find" operation
  this->regmatch = rxp.regmatch;
  this->regmust = rxp.regmust; // Copy field
  if (rxp.regmust) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart; // Copy starting index
  this->reganch = rxp.reganch;   // Copy remaining private data
  this->regmlen = rxp.regmlen;   // Copy remaining private data
}